

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkCore.c
# Opt level: O1

int Lpk_NodeHasChanged(Lpk_Man_t *p,int iNode)

{
  int iVar1;
  void *pvVar2;
  Vec_Ptr_t *pVVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  
  if ((iNode < 0) || (p->vVisited->nSize <= iNode)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecVec.h"
                  ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
  }
  pvVar2 = p->vVisited->pArray[(uint)iNode];
  iVar1 = *(int *)((long)pvVar2 + 4);
  iVar4 = 1;
  if (iVar1 != 0) {
    if (1 < iVar1) {
      pVVar3 = p->pNtk->vObjs;
      lVar5 = 0;
      do {
        uVar6 = (uint)*(undefined8 *)(*(long *)((long)pvVar2 + 8) + lVar5 * 8);
        if (((int)uVar6 < 0) || (pVVar3->nSize <= (int)uVar6)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        if (pVVar3->pArray[uVar6 & 0x7fffffff] == (void *)0x0) {
          return 1;
        }
        iVar4 = (int)lVar5;
        lVar5 = lVar5 + 2;
      } while (iVar4 + 3 < iVar1);
    }
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int Lpk_NodeHasChanged( Lpk_Man_t * p, int iNode )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pTemp, * pTemp2;
    int i;
    vNodes = Vec_VecEntry( p->vVisited, iNode );
    if ( Vec_PtrSize(vNodes) == 0 )
        return 1;
    Vec_PtrForEachEntryDouble( Abc_Obj_t *, Abc_Obj_t *, vNodes, pTemp, pTemp2, i )
    {
        // check if the node has changed
        pTemp = Abc_NtkObj( p->pNtk, (int)(ABC_PTRUINT_T)pTemp );
        if ( pTemp == NULL )
            return 1;
        // check if the number of fanouts has changed
//        if ( Abc_ObjFanoutNum(pTemp) != (int)Vec_PtrEntry(vNodes, i+1) )
//            return 1;
//        i++;
    }
    return 0;
}